

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

char * p2sc_get_keyvalue(p2sc_keyfile_t *k,char *group,char *key)

{
  char *pcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *ret;
  GError *err;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar1 = (char *)g_key_file_get_value(*in_RDI,in_RSI,in_RDX,&local_20);
  if ((pcVar1 != (char *)0x0) && (local_20 == 0)) {
    return pcVar1;
  }
  if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
    _p2sc_msg("p2sc_get_keyvalue",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x41,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,"%s: %s",local_8[1],
              *(undefined8 *)(local_20 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_get_keyvalue",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x44,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
            "%s: value of %s not found in group %s",local_8[1],local_18,local_10);
  exit(1);
}

Assistant:

char *p2sc_get_keyvalue(p2sc_keyfile_t *k, const char *group, const char *key) {
    GError *err = NULL;
    char *ret = g_key_file_get_value(k->key, group, key, &err);

    if (!ret || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "%s: %s", k->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "%s: value of %s not found in group %s", k->name, key, group);
        /* not reached */
        g_free(ret);
        ret = NULL;
    }
    return ret;
}